

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  element_type *peVar2;
  cmState *pcVar3;
  string *psVar4;
  ostream *os;
  char *local_108;
  cmStateDirectory local_d0;
  string local_a8;
  undefined1 local_78 [8];
  cmStateSnapshot bottom;
  cmListFileContext lfc;
  ostream *out_local;
  cmListFileBacktrace *this_local;
  
  lfc.Line = (long)out;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar1 = Entry::IsBottom(peVar2);
    if (!bVar1) {
      peVar2 = std::
               __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      cmListFileContext::cmListFileContext
                ((cmListFileContext *)&bottom.Position.Position,(cmListFileContext *)peVar2);
      GetBottom((cmStateSnapshot *)local_78,this);
      pcVar3 = cmStateSnapshot::GetState((cmStateSnapshot *)local_78);
      bVar1 = cmState::GetIsInTryCompile(pcVar3);
      if (!bVar1) {
        cmStateSnapshot::GetDirectory(&local_d0,(cmStateSnapshot *)local_78);
        pcVar3 = cmStateSnapshot::GetState((cmStateSnapshot *)local_78);
        psVar4 = cmState::GetSourceDirectory_abi_cxx11_(pcVar3);
        cmStateDirectory::ConvertToRelPathIfNotContained
                  (&local_a8,&local_d0,psVar4,(string *)((long)&lfc.Name.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      if (lfc.FilePath.field_2._8_8_ == 0) {
        local_108 = " in ";
      }
      else {
        local_108 = " at ";
      }
      os = std::operator<<((ostream *)lfc.Line,local_108);
      ::operator<<(os,(cmListFileContext *)&bottom.Position.Position);
      cmListFileContext::~cmListFileContext((cmListFileContext *)&bottom.Position.Position);
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  // The title exists only if we have a call on top of the bottom.
  if (!this->TopEntry || this->TopEntry->IsBottom()) {
    return;
  }
  cmListFileContext lfc = this->TopEntry->Context;
  cmStateSnapshot bottom = this->GetBottom();
  if (!bottom.GetState()->GetIsInTryCompile()) {
    lfc.FilePath = bottom.GetDirectory().ConvertToRelPathIfNotContained(
      bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}